

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL5RInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  void *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Opcode;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  DecodeStatus DVar2;
  
  MCInst_clear(in_RDI);
  uVar1 = fieldFromInstruction_4(in_ESI,0x1b,5);
  if (uVar1 == 0) {
    MCInst_setOpcode(in_RDI,0xa5);
    DVar2 = DecodeL6RInstruction
                      ((MCInst *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (uint)((ulong)in_RDI >> 0x20),CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_RDX);
  }
  else {
    DVar2 = MCDisassembler_Fail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeL5RInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Opcode;

	// Try and decode as a L6R instruction.
	MCInst_clear(Inst);
	Opcode = fieldFromInstruction_4(Insn, 27, 5);
	switch (Opcode) {
		default:
			break;
		case 0x00:
			MCInst_setOpcode(Inst, XCore_LMUL_l6r);
			return DecodeL6RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}